

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

void __thiscall AbstractModuleClient::~AbstractModuleClient(AbstractModuleClient *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_MlmWrap)._vptr_MlmWrap = (_func_int **)&PTR__AbstractModuleClient_002e70b8;
  if (this->timestampsub != (zsock_t *)0x0) {
    zsock_destroy_checked
              (&this->timestampsub,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/AbstractModuleClient.cpp"
               ,0x18);
  }
  pcVar2 = (this->timestampaddress)._M_dataplus._M_p;
  paVar1 = &(this->timestampaddress).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->subbedEvents)._M_t);
  BrokerClient::~BrokerClient((BrokerClient *)this);
  return;
}

Assistant:

AbstractModuleClient::~AbstractModuleClient() {
    this->closeConnections();
}